

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_emit_x86.h
# Opt level: O0

void emit_call_(ASMState *as,MCode *target)

{
  MCode *pMVar1;
  uint64_t in_RSI;
  ASMState *in_RDI;
  MCode *p;
  ptrdiff_t delta;
  ASMState *in_stack_ffffffffffffffe0;
  
  pMVar1 = in_RDI->mcp;
  if (in_RSI - (long)pMVar1 == (long)((int)in_RSI - (int)pMVar1)) {
    *(int *)(pMVar1 + -4) = (int)in_RSI - (int)pMVar1;
    pMVar1[-5] = 0xe8;
    in_RDI->mcp = pMVar1 + -5;
  }
  else {
    emit_rr(in_RDI,XO_GROUP5,2,0);
    emit_loadu64(in_stack_ffffffffffffffe0,(Reg)((ulong)in_RDI >> 0x20),in_RSI);
  }
  return;
}

Assistant:

static void emit_call_(ASMState *as, MCode *target)
{
  MCode *p = as->mcp;
#if LJ_64
  if (target-p != (int32_t)(target-p)) {
    /* Assumes RID_RET is never an argument to calls and always clobbered. */
    emit_rr(as, XO_GROUP5, XOg_CALL, RID_RET);
    emit_loadu64(as, RID_RET, (uint64_t)target);
    return;
  }
#endif
  *(int32_t *)(p-4) = jmprel(as->J, p, target);
  p[-5] = XI_CALL;
  as->mcp = p - 5;
}